

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon_maps.c
# Opt level: O0

void set_dungeon_tile(dw_rom *rom,dw_map_index town,uint8_t x,uint8_t y,uint8_t tile)

{
  BOOL BVar1;
  ulong uVar2;
  long lVar3;
  size_t data_addr;
  size_t offset;
  byte local_17;
  uint8_t oldval;
  BOOL roof_data;
  uint8_t tile_local;
  uint8_t y_local;
  uint8_t x_local;
  dw_map_index town_local;
  dw_rom *rom_local;
  
  uVar2 = (ulong)y * (long)(int)((rom->map).meta[town].width + 1) + (ulong)x;
  lVar3 = (long)(int)(*(ushort *)(rom->map).meta[town].pointer & 0x7fff) + (uVar2 >> 1);
  if (((rom->map).meta[town].width < x) || ((rom->map).meta[town].height < y)) {
    printf("Map index (%d, %d) out of bounds, skipping tile setting...\n",(ulong)x,(ulong)y);
    printf("Map: %d, Width: %d, Height: %d\n",(ulong)town,(ulong)(rom->map).meta[town].width,
           (ulong)(rom->map).meta[town].height);
    printf("This is a bug.\n");
  }
  else {
    BVar1 = contains_roof_data(town);
    local_17 = tile;
    if ((BVar1 != FALSE) && ((tile & 8) != 0)) {
      printf("Invalid tile %d for map number %d\n",(ulong)tile,(ulong)town);
      printf("This is a bug.\n");
      local_17 = tile & 7;
    }
    if ((uVar2 & 1) == 0) {
      if (BVar1 == FALSE) {
        rom->content[lVar3] = rom->content[lVar3] & 0xf;
      }
      else {
        rom->content[lVar3] = rom->content[lVar3] & 0x8f;
      }
      rom->content[lVar3] = rom->content[lVar3] | local_17 << 4;
    }
    else {
      if (BVar1 == FALSE) {
        rom->content[lVar3] = rom->content[lVar3] & 0xf0;
      }
      else {
        rom->content[lVar3] = rom->content[lVar3] & 0xf8;
      }
      rom->content[lVar3] = rom->content[lVar3] | local_17;
    }
  }
  return;
}

Assistant:

void set_dungeon_tile(dw_rom *rom, dw_map_index town, uint8_t x,
        uint8_t y, uint8_t tile)
{
    BOOL roof_data;
    uint8_t oldval;
    size_t offset = (size_t)y * (rom->map.meta[town].width+1) + x;
    size_t data_addr = ((*(uint16_t*)(&rom->map.meta[town].pointer)) & 0x7fff) +
        offset/2;

    if (x > rom->map.meta[town].width || y > rom->map.meta[town].height) {
        printf("Map index (%d, %d) out of bounds, skipping tile setting...\n",
                x, y);
        printf("Map: %d, Width: %d, Height: %d\n", town, 
                rom->map.meta[town].width, rom->map.meta[town].height);
        printf("This is a bug.\n");
        return;
    }

    /* Preserve the MSB for some maps, as they contain roof data for towns. */
    roof_data = contains_roof_data(town);
    if (roof_data && (tile & 8)) {
        printf("Invalid tile %d for map number %d\n", tile, town);
        printf("This is a bug.\n");
        tile &= 7;
    }
    oldval = rom->content[data_addr];
    if (offset % 2) {
        if (roof_data) {
            rom->content[data_addr] &= 0xf8;
        } else {
            rom->content[data_addr] &= 0xf0;
        }
        rom->content[data_addr] |= tile;
    } else {
        if (roof_data) {
            rom->content[data_addr] &= 0x8f;
        } else {
            rom->content[data_addr] &= 0x0f;
        }
        rom->content[data_addr] |= tile << 4;
    }
}